

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O3

BtorSimBitVector * btorsim_bv_new(uint32_t bw)

{
  uint uVar1;
  byte bVar2;
  BtorSimBitVector *pBVar3;
  uint in_ECX;
  int extraout_EDX;
  uint uVar4;
  uint32_t in_ESI;
  BtorSimRNG *rng;
  uint32_t uVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  
  uVar5 = ((bw >> 5) + 1) - (uint)((bw & 0x1f) == 0);
  uVar6 = (ulong)(uVar5 * 4);
  rng = (BtorSimRNG *)(uVar6 + 8);
  pBVar3 = (BtorSimBitVector *)malloc((size_t)rng);
  if (pBVar3 != (BtorSimBitVector *)0x0) {
    memset(pBVar3 + 1,0,uVar6);
    pBVar3->len = uVar5;
    pBVar3->width = bw;
    return pBVar3;
  }
  btorsim_bv_new_cold_1();
  pBVar3 = btorsim_bv_new(in_ESI);
  uVar1 = pBVar3->len;
  uVar6 = (ulong)uVar1;
  if (1 < uVar6) {
    lVar7 = 0;
    do {
      uVar5 = btorsim_rng_rand(rng);
      (&pBVar3[1].len)[lVar7] = uVar5;
      lVar7 = lVar7 + 1;
    } while (uVar6 - 1 != lVar7);
  }
  uVar8 = 0;
  uVar5 = btorsim_rng_pick_rand(rng,0,0xfffffffe);
  pBVar3[1].width = uVar5;
  if (in_ECX != 0) {
    do {
      bVar2 = (byte)uVar8 & 0x1f;
      (&pBVar3[1].width)[~(uVar8 >> 5) + uVar1] =
           (&pBVar3[1].width)[~(uVar8 >> 5) + uVar1] & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      uVar8 = uVar8 + 1;
    } while (in_ECX != uVar8);
  }
  uVar8 = pBVar3->width;
  uVar4 = extraout_EDX + 1;
  if (uVar4 < uVar8) {
    do {
      bVar2 = (byte)uVar4 & 0x1f;
      (&pBVar3[1].width)[~(uVar4 >> 5) + uVar1] =
           (&pBVar3[1].width)[~(uVar4 >> 5) + uVar1] & (-2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2);
      uVar4 = uVar4 + 1;
    } while (uVar8 != uVar4);
  }
  if (uVar6 << 5 != (ulong)uVar8) {
    pBVar3[1].width = pBVar3[1].width & 0x7fffffffU >> (~(byte)uVar8 & 0x1f);
  }
  return pBVar3;
}

Assistant:

BtorSimBitVector *
btorsim_bv_new (uint32_t bw)
{
  assert (bw > 0);

  uint32_t i;
  BtorSimBitVector *res;

  i = bw / BTORSIM_BV_TYPE_BW;
  if (bw % BTORSIM_BV_TYPE_BW > 0) i += 1;

  assert (i > 0);
  res =
      btorsim_malloc (sizeof (BtorSimBitVector) + sizeof (BTORSIM_BV_TYPE) * i);
  memset (res->bits, 0, i * sizeof *(res->bits));
  res->len = i;
  assert (res->len);
  res->width = bw;
  return res;
}